

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idct.c
# Opt level: O3

void av1_highbd_inv_txfm_add_c(tran_low_t *input,uint8_t *dest,int stride,TxfmParam *txfm_param)

{
  int bd_00;
  int bd;
  
  switch(txfm_param->tx_size) {
  case '\0':
    break;
  case '\x01':
    av1_inv_txfm2d_add_8x8_c
              (input,(uint16_t *)((long)dest * 2),stride,txfm_param->tx_type,txfm_param->bd);
    return;
  case '\x02':
    av1_inv_txfm2d_add_16x16_c
              (input,(uint16_t *)((long)dest * 2),stride,txfm_param->tx_type,txfm_param->bd);
    return;
  case '\x03':
    av1_inv_txfm2d_add_32x32_c
              (input,(uint16_t *)((long)dest * 2),stride,txfm_param->tx_type,txfm_param->bd);
    return;
  case '\x04':
    av1_inv_txfm2d_add_64x64_c
              (input,(uint16_t *)((long)dest * 2),stride,txfm_param->tx_type,txfm_param->bd);
    return;
  case '\x05':
    av1_inv_txfm2d_add_4x8_c
              (input,(uint16_t *)((long)dest * 2),stride,txfm_param->tx_type,txfm_param->bd);
    return;
  case '\x06':
    av1_inv_txfm2d_add_8x4_c
              (input,(uint16_t *)((long)dest * 2),stride,txfm_param->tx_type,txfm_param->bd);
    return;
  case '\a':
    av1_inv_txfm2d_add_8x16_c
              (input,(uint16_t *)((long)dest * 2),stride,txfm_param->tx_type,txfm_param->bd);
    return;
  case '\b':
    av1_inv_txfm2d_add_16x8_c
              (input,(uint16_t *)((long)dest * 2),stride,txfm_param->tx_type,txfm_param->bd);
    return;
  case '\t':
    av1_inv_txfm2d_add_16x32_c
              (input,(uint16_t *)((long)dest * 2),stride,txfm_param->tx_type,txfm_param->bd);
    return;
  case '\n':
    av1_inv_txfm2d_add_32x16_c
              (input,(uint16_t *)((long)dest * 2),stride,txfm_param->tx_type,txfm_param->bd);
    return;
  case '\v':
    av1_inv_txfm2d_add_32x64_c
              (input,(uint16_t *)((long)dest * 2),stride,txfm_param->tx_type,txfm_param->bd);
    return;
  case '\f':
    av1_inv_txfm2d_add_64x32_c
              (input,(uint16_t *)((long)dest * 2),stride,txfm_param->tx_type,txfm_param->bd);
    return;
  case '\r':
    av1_inv_txfm2d_add_4x16_c
              (input,(uint16_t *)((long)dest * 2),stride,txfm_param->tx_type,txfm_param->bd);
    return;
  case '\x0e':
    av1_inv_txfm2d_add_16x4_c
              (input,(uint16_t *)((long)dest * 2),stride,txfm_param->tx_type,txfm_param->bd);
    return;
  case '\x0f':
    av1_inv_txfm2d_add_8x32_c
              (input,(uint16_t *)((long)dest * 2),stride,txfm_param->tx_type,txfm_param->bd);
    return;
  case '\x10':
    av1_inv_txfm2d_add_32x8_c
              (input,(uint16_t *)((long)dest * 2),stride,txfm_param->tx_type,txfm_param->bd);
    return;
  case '\x11':
    av1_inv_txfm2d_add_16x64_c
              (input,(uint16_t *)((long)dest * 2),stride,txfm_param->tx_type,txfm_param->bd);
    return;
  case '\x12':
    av1_inv_txfm2d_add_64x16_c
              (input,(uint16_t *)((long)dest * 2),stride,txfm_param->tx_type,txfm_param->bd);
    return;
  default:
    return;
  }
  bd_00 = txfm_param->bd;
  if (txfm_param->lossless == 0) {
    av1_inv_txfm2d_add_4x4_c(input,(uint16_t *)((long)dest * 2),stride,txfm_param->tx_type,bd_00);
    return;
  }
  if (txfm_param->eob < 2) {
    av1_highbd_iwht4x4_1_add_c(input,dest,stride,bd_00);
    return;
  }
  (*av1_highbd_iwht4x4_16_add)(input,dest,stride,bd_00);
  return;
}

Assistant:

void av1_highbd_inv_txfm_add_c(const tran_low_t *input, uint8_t *dest,
                               int stride, const TxfmParam *txfm_param) {
  assert(av1_ext_tx_used[txfm_param->tx_set_type][txfm_param->tx_type]);
  const TX_SIZE tx_size = txfm_param->tx_size;
  switch (tx_size) {
    case TX_32X32:
      highbd_inv_txfm_add_32x32_c(input, dest, stride, txfm_param);
      break;
    case TX_16X16:
      highbd_inv_txfm_add_16x16_c(input, dest, stride, txfm_param);
      break;
    case TX_8X8:
      highbd_inv_txfm_add_8x8_c(input, dest, stride, txfm_param);
      break;
    case TX_4X8:
      highbd_inv_txfm_add_4x8_c(input, dest, stride, txfm_param);
      break;
    case TX_8X4:
      highbd_inv_txfm_add_8x4_c(input, dest, stride, txfm_param);
      break;
    case TX_8X16:
      highbd_inv_txfm_add_8x16_c(input, dest, stride, txfm_param);
      break;
    case TX_16X8:
      highbd_inv_txfm_add_16x8_c(input, dest, stride, txfm_param);
      break;
    case TX_16X32:
      highbd_inv_txfm_add_16x32_c(input, dest, stride, txfm_param);
      break;
    case TX_32X16:
      highbd_inv_txfm_add_32x16_c(input, dest, stride, txfm_param);
      break;
    case TX_64X64:
      highbd_inv_txfm_add_64x64_c(input, dest, stride, txfm_param);
      break;
    case TX_32X64:
      highbd_inv_txfm_add_32x64_c(input, dest, stride, txfm_param);
      break;
    case TX_64X32:
      highbd_inv_txfm_add_64x32_c(input, dest, stride, txfm_param);
      break;
    case TX_16X64:
      highbd_inv_txfm_add_16x64_c(input, dest, stride, txfm_param);
      break;
    case TX_64X16:
      highbd_inv_txfm_add_64x16_c(input, dest, stride, txfm_param);
      break;
    case TX_4X4:
      // this is like av1_short_idct4x4 but has a special case around eob<=1
      // which is significant (not just an optimization) for the lossless
      // case.
      highbd_inv_txfm_add_4x4_c(input, dest, stride, txfm_param);
      break;
    case TX_16X4:
      highbd_inv_txfm_add_16x4_c(input, dest, stride, txfm_param);
      break;
    case TX_4X16:
      highbd_inv_txfm_add_4x16_c(input, dest, stride, txfm_param);
      break;
    case TX_8X32:
      highbd_inv_txfm_add_8x32_c(input, dest, stride, txfm_param);
      break;
    case TX_32X8:
      highbd_inv_txfm_add_32x8_c(input, dest, stride, txfm_param);
      break;
    default: assert(0 && "Invalid transform size"); break;
  }
}